

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

ostream * pstack::operator<<(ostream *os,
                            JSON<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                            *json)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ostream *poVar3;
  long *local_68;
  long local_60;
  long local_58 [2];
  Escape local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
  pcVar2 = (json->object->_M_dataplus)._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + json->object->_M_string_length);
  paVar1 = &local_48.value.field_2;
  local_48.value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_68,local_60 + (long)local_68);
  poVar3 = operator<<(os,&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.value._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.value._M_dataplus._M_p,local_48.value.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return poVar3;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<std::string, C> &json) {
   return os << "\"" << Escape(json.object) << "\"";
}